

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall logger::select_file(logger *this,string *file)

{
  size_type sVar1;
  
  sVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->m_open_files)._M_h,file);
  if (sVar1 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_selected_file);
    return;
  }
  return;
}

Assistant:

void select_file(const std::string& file)
  {
    if (m_open_files.count(file))
      m_selected_file = file;
  }